

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

void Fossilize::
     serialize_application_info_inline<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (Value *value,VkApplicationInfo *info,
               MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc)

{
  char *pcVar1;
  Data local_98;
  Data local_80;
  GenericStringRef<char> local_70;
  StringRefType local_60;
  GenericStringRef<char> local_50;
  StringRefType local_40;
  
  pcVar1 = info->pApplicationName;
  if (pcVar1 != (char *)0x0) {
    local_40.s = "applicationName";
    local_40.length = 0xf;
    local_50.s = pcVar1;
    local_50.length = rapidjson::GenericStringRef<char>::NotNullStrLen(&local_50,pcVar1);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember(value,&local_40,&local_50,alloc);
  }
  pcVar1 = info->pEngineName;
  if (pcVar1 != (char *)0x0) {
    local_60.s = "engineName";
    local_60.length = 10;
    local_70.s = pcVar1;
    local_70.length = rapidjson::GenericStringRef<char>::NotNullStrLen(&local_70,pcVar1);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember(value,&local_60,&local_70,alloc);
  }
  local_80._4_1_ = '\0';
  local_80._5_1_ = '\0';
  local_80._6_1_ = '\0';
  local_80._7_1_ = '\0';
  local_80._0_4_ = info->applicationVersion;
  local_98.s.str = (Ch *)0x405000000165569;
  local_98.n = (Number)0x12;
  local_80.s.str = (Ch *)((ulong)(-1 < (int)info->applicationVersion) << 0x35 | 0x1d6000000000000);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(value,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_98.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_80.s,alloc);
  local_80._4_1_ = '\0';
  local_80._5_1_ = '\0';
  local_80._6_1_ = '\0';
  local_80._7_1_ = '\0';
  local_80._0_4_ = info->engineVersion;
  local_98.s.str = (Ch *)0x40500000016557c;
  local_98.n = (Number)0xd;
  local_80.s.str = (Ch *)((ulong)(-1 < (int)info->engineVersion) << 0x35 | 0x1d6000000000000);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(value,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_98.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_80.s,alloc);
  local_80._4_1_ = '\0';
  local_80._5_1_ = '\0';
  local_80._6_1_ = '\0';
  local_80._7_1_ = '\0';
  local_80._0_4_ = info->apiVersion;
  local_98.s.str = (Ch *)0x40500000016554b;
  local_98.n = (Number)0xa;
  local_80.s.str = (Ch *)((ulong)(-1 < (int)info->apiVersion) << 0x35 | 0x1d6000000000000);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(value,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_98.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_80.s,alloc);
  return;
}

Assistant:

static void serialize_application_info_inline(Value &value, const VkApplicationInfo &info, AllocType &alloc)
{
	if (info.pApplicationName)
		value.AddMember("applicationName", StringRef(info.pApplicationName), alloc);
	if (info.pEngineName)
		value.AddMember("engineName", StringRef(info.pEngineName), alloc);
	value.AddMember("applicationVersion", info.applicationVersion, alloc);
	value.AddMember("engineVersion", info.engineVersion, alloc);
	value.AddMember("apiVersion", info.apiVersion, alloc);
}